

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualSlackViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *v;
  Item *pIVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  cpp_dec_float<50U,_int,_void> local_128;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f0;
  undefined1 local_e8 [16];
  uint local_d8 [3];
  undefined3 uStack_cb;
  uint local_c8 [3];
  bool local_bc;
  undefined8 local_b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_90;
  cpp_dec_float<50U,_int,_void> *local_78;
  long local_70;
  undefined1 local_68 [16];
  uint local_58 [3];
  undefined3 uStack_4b;
  uint local_48 [3];
  bool local_3c;
  undefined8 local_38;
  
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
  local_78 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_90,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_a8,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_90);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x61])(this,&local_a8);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar6 = 0;
    local_f0 = this;
    do {
      pIVar8 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar6].idx;
      local_38._0_4_ = cpp_dec_float_finite;
      local_38._4_4_ = 10;
      local_68 = (undefined1  [16])0x0;
      local_58[0] = 0;
      local_58[1] = 0;
      stack0xffffffffffffffb0 = 0;
      uStack_4b = 0;
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_3c = false;
      local_70 = lVar6;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_68,0.0);
      if (0 < (pIVar8->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar9 = 0;
        lVar6 = 0;
        do {
          pNVar2 = (pIVar8->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar2->val).m_backend.data._M_elems + lVar9);
          pcVar7 = &local_90.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar2->val + 1) + lVar9)].m_backend;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems._24_5_ = 0;
          local_128.data._M_elems[7]._1_3_ = 0;
          local_128.data._M_elems[8] = 0;
          local_128.data._M_elems[9] = 0;
          local_128.exp = 0;
          local_128.neg = false;
          v = pcVar1;
          if ((&local_128 != pcVar7) && (v = pcVar7, pcVar1 != &local_128)) {
            local_128.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_128.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_128.exp = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar9);
            local_128.neg = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar9 + 4);
            local_128._48_8_ =
                 *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar9 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)local_68,&local_128);
          lVar6 = lVar6 + 1;
          lVar9 = lVar9 + 0x3c;
        } while (lVar6 < (pIVar8->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      lVar6 = local_70;
      local_b8._0_4_ = cpp_dec_float_finite;
      local_b8._4_4_ = 10;
      local_e8 = (undefined1  [16])0x0;
      local_d8[0] = 0;
      local_d8[1] = 0;
      stack0xffffffffffffff30 = 0;
      uStack_cb = 0;
      local_c8[0] = 0;
      local_c8[1] = 0;
      local_c8[2] = 0;
      local_bc = false;
      if ((cpp_dec_float<50U,_int,_void> *)local_e8 ==
          &local_a8.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_70].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_e8,
                   (cpp_dec_float<50U,_int,_void> *)local_68);
        if (local_e8._0_4_ != 0 || (fpclass_type)local_b8 != cpp_dec_float_finite) {
          local_bc = (bool)(local_bc ^ 1);
        }
      }
      else {
        local_c8[0] = local_48[0];
        local_c8[1] = local_48[1];
        local_d8[0] = local_58[0];
        local_d8[1] = local_58[1];
        stack0xffffffffffffff30 = stack0xffffffffffffffb0;
        uStack_cb = uStack_4b;
        local_e8 = local_68;
        local_c8[2] = local_48[2];
        local_bc = local_3c;
        local_b8._0_4_ = (fpclass_type)local_38;
        local_b8._4_4_ = local_38._4_4_;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_e8,
                   &local_a8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_70].m_backend);
      }
      this = local_f0;
      local_128.data._M_elems[8] = local_c8[0];
      local_128.data._M_elems[9] = local_c8[1];
      local_128.data._M_elems[4] = local_d8[0];
      local_128.data._M_elems[5] = local_d8[1];
      local_128.data._M_elems._24_5_ = stack0xffffffffffffff30;
      local_128.data._M_elems[7]._1_3_ = uStack_cb;
      local_128.data._M_elems[0] = local_e8._0_4_;
      local_128.data._M_elems[1] = local_e8._4_4_;
      local_128.data._M_elems[2] = local_e8._8_4_;
      local_128.data._M_elems[3] = local_e8._12_4_;
      auVar4 = (undefined1  [16])local_128.data._M_elems._0_16_;
      local_128.exp = local_c8[2];
      local_128.neg = local_bc;
      local_128.fpclass = (fpclass_type)local_b8;
      local_128.prec_elem = local_b8._4_4_;
      if ((local_bc == true) &&
         (local_128.data._M_elems[0] = local_e8._0_4_,
         local_128.data._M_elems[0] != 0 || (fpclass_type)local_b8 != cpp_dec_float_finite)) {
        local_128.neg = false;
      }
      local_128.data._M_elems._0_16_ = auVar4;
      if ((((fpclass_type)local_b8 != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_128,&maxviol->m_backend), 0 < iVar5)) {
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_128.data._M_elems._32_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_128.data._M_elems._16_8_;
        *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
             CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
        *(undefined8 *)(maxviol->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_128.data._M_elems._8_8_;
        (maxviol->m_backend).exp = local_128.exp;
        (maxviol->m_backend).neg = local_128.neg;
        (maxviol->m_backend).fpclass = local_128.fpclass;
        (maxviol->m_backend).prec_elem = local_128.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (local_78,&local_128);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (local_a8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}